

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

bool lpDimensionsOk(string *message,HighsLp *lp,HighsLogOptions *log_options)

{
  bool bVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pdVar4;
  bool bVar5;
  HighsStatus HVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  vector<int,_std::allocator<int>_> a_matrix_p_end;
  vector<double,_std::allocator<double>_> *matrix_value;
  undefined8 uVar22;
  undefined4 uVar23;
  vector<int,_std::allocator<int>_> local_48;
  
  uVar14 = lp->num_col_;
  uVar7 = lp->num_row_;
  if ((int)uVar14 < 0) {
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on num_col = %d >= 0\n",
                 (message->_M_dataplus)._M_p,(ulong)uVar14);
  }
  if ((int)uVar7 < 0) {
    highsLogUser(log_options,kError,"LP dimension validation (%s) fails on num_row = %d >= 0\n",
                 (message->_M_dataplus)._M_p);
  }
  if ((int)(uVar7 | uVar14) < 0) {
    bVar5 = false;
  }
  else {
    uVar11 = (ulong)((long)(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar19 = (ulong)((long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar16 = (ulong)((long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    iVar9 = (int)uVar11;
    if (iVar9 < (int)uVar14) {
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on col_cost.size() = %d < %d = num_col\n",
                   (message->_M_dataplus)._M_p,uVar11 & 0xffffffff,(ulong)uVar14);
    }
    iVar17 = (int)uVar19;
    if (iVar17 < (int)uVar14) {
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on col_lower.size() = %d < %d = num_col\n",
                   (message->_M_dataplus)._M_p,uVar19 & 0xffffffff,(ulong)uVar14);
    }
    iVar15 = (int)uVar16;
    if (iVar15 < (int)uVar14) {
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on col_upper.size() = %d < %d = num_col\n",
                   (message->_M_dataplus)._M_p,uVar16 & 0xffffffff,(ulong)uVar14);
    }
    uVar12 = (lp->a_matrix_).format_ - kColwise;
    if (1 < uVar12) {
      highsLogUser(log_options,kError,"LP dimension validation (%s) fails on a_matrix_.format\n",
                   (message->_M_dataplus)._M_p);
    }
    bVar5 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
    uVar8 = uVar7;
    if (bVar5) {
      uVar8 = uVar14;
    }
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    matrix_value = &(lp->a_matrix_).value_;
    HVar6 = assessMatrixDimensions
                      (log_options,uVar8,false,&(lp->a_matrix_).start_,&local_48,
                       &(lp->a_matrix_).index_,matrix_value);
    uVar23 = (undefined4)((ulong)matrix_value >> 0x20);
    if (HVar6 != kOk) {
      highsLogUser(log_options,kError,"LP dimension validation (%s) fails on a_matrix dimensions\n",
                   (message->_M_dataplus)._M_p);
    }
    pdVar3 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar11 = (ulong)((long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    pdVar4 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar18 = (int)uVar11;
    if (iVar18 < (int)uVar7) {
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on row_lower.size() = %d < %d = num_row\n",
                   (message->_M_dataplus)._M_p,uVar11 & 0xffffffff,(ulong)uVar7);
    }
    uVar11 = (ulong)((long)pdVar3 - (long)pdVar4) >> 3;
    iVar10 = (int)uVar11;
    if (iVar10 < (int)uVar7) {
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on row_upper.size() = %d < %d = num_row\n",
                   (message->_M_dataplus)._M_p,uVar11 & 0xffffffff,(ulong)uVar7);
    }
    uVar8 = (lp->a_matrix_).num_col_;
    uVar2 = (lp->a_matrix_).num_row_;
    if (uVar8 == uVar14) {
      bVar5 = (((((int)uVar14 <= iVar15 && uVar12 < 2) &&
                ((int)uVar14 <= iVar9 && (int)uVar14 <= iVar17)) && HVar6 == kOk) &&
              (int)uVar7 <= iVar18) && (int)uVar7 <= iVar10;
    }
    else {
      bVar5 = false;
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on a_matrix.num_col_ = %d != %d = num_col\n",
                   (message->_M_dataplus)._M_p,(ulong)uVar8,(ulong)uVar14);
    }
    if (uVar2 != uVar7) {
      bVar5 = false;
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on a_matrix.num_row_ = %d != %d = num_row\n",
                   (message->_M_dataplus)._M_p,(ulong)(uint)(lp->a_matrix_).num_row_,(ulong)uVar7);
    }
    if ((lp->scale_).strategy < 0) {
      bVar5 = false;
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.scale_strategy\n",
                   (message->_M_dataplus)._M_p);
    }
    uVar16 = (ulong)((long)(lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lp->scale_).row.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar11 = (ulong)((long)(lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(lp->scale_).col.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3;
    bVar1 = (lp->scale_).has_scaling;
    iVar17 = (int)uVar16;
    iVar9 = (int)uVar11;
    if (bVar1 == true) {
      bVar20 = (int)uVar7 <= iVar17;
      bVar21 = (int)uVar14 <= iVar9;
      uVar12 = uVar7;
      uVar8 = uVar14;
    }
    else {
      bVar20 = iVar17 == 0;
      bVar21 = iVar9 == 0;
      uVar8 = 0;
      uVar12 = 0;
    }
    uVar2 = (lp->scale_).num_row;
    if ((lp->scale_).num_col != uVar8) {
      bVar5 = false;
      uVar19 = 0;
      if (bVar1 != false) {
        uVar19 = (ulong)uVar14;
      }
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.num_col = %d != %d\n",
                   (message->_M_dataplus)._M_p,(ulong)(uint)(lp->scale_).num_col,uVar19);
    }
    if (uVar2 != uVar12) {
      bVar5 = false;
      uVar19 = 0;
      if ((lp->scale_).has_scaling != false) {
        uVar19 = (ulong)uVar7;
      }
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.num_row = %d != %d\n",
                   (message->_M_dataplus)._M_p,(ulong)(uint)(lp->scale_).num_row,uVar19);
    }
    if (!bVar21) {
      pcVar13 = "==";
      bVar5 = false;
      if ((lp->scale_).has_scaling == false) {
        uVar14 = 0;
      }
      else {
        pcVar13 = ">=";
      }
      uVar22 = CONCAT44(uVar23,uVar14);
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.col.size() = %d %s %d\n",
                   (message->_M_dataplus)._M_p,uVar11 & 0xffffffff,pcVar13,uVar22);
      uVar23 = (undefined4)((ulong)uVar22 >> 0x20);
    }
    if (!bVar20) {
      pcVar13 = "==";
      bVar5 = false;
      if ((lp->scale_).has_scaling == false) {
        uVar7 = 0;
      }
      else {
        pcVar13 = ">=";
      }
      highsLogUser(log_options,kError,
                   "LP dimension validation (%s) fails on scale_.row.size() = %d %s %d\n",
                   (message->_M_dataplus)._M_p,uVar16 & 0xffffffff,pcVar13,CONCAT44(uVar23,uVar7));
    }
    if (bVar5 == false) {
      highsLogUser(log_options,kError,"LP dimension validation (%s) fails\n",
                   (message->_M_dataplus)._M_p);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return bVar5;
}

Assistant:

bool lpDimensionsOk(std::string message, const HighsLp& lp,
                    const HighsLogOptions& log_options) {
  bool ok = true;
  const HighsInt num_col = lp.num_col_;
  const HighsInt num_row = lp.num_row_;
  if (!(num_col >= 0))
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on num_col = %d >= 0\n",
                 message.c_str(), (int)num_col);
  ok = num_col >= 0 && ok;
  if (!(num_row >= 0))
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on num_row = %d >= 0\n",
                 message.c_str(), (int)num_row);
  ok = num_row >= 0 && ok;
  if (!ok) return ok;

  HighsInt col_cost_size = lp.col_cost_.size();
  HighsInt col_lower_size = lp.col_lower_.size();
  HighsInt col_upper_size = lp.col_upper_.size();
  bool legal_col_cost_size = col_cost_size >= num_col;
  bool legal_col_lower_size = col_lower_size >= num_col;
  bool legal_col_upper_size = col_upper_size >= num_col;
  if (!legal_col_cost_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_cost.size() = %d < "
                 "%d = num_col\n",
                 message.c_str(), (int)col_cost_size, (int)num_col);
  ok = legal_col_cost_size && ok;
  if (!legal_col_lower_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_lower.size() = %d "
                 "< %d = num_col\n",
                 message.c_str(), (int)col_lower_size, (int)num_col);
  ok = legal_col_lower_size && ok;
  if (!legal_col_upper_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on col_upper.size() = %d "
                 "< %d = num_col\n",
                 message.c_str(), (int)col_upper_size, (int)num_col);
  ok = legal_col_upper_size && ok;

  bool legal_format = lp.a_matrix_.format_ == MatrixFormat::kColwise ||
                      lp.a_matrix_.format_ == MatrixFormat::kRowwise;
  if (!legal_format)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix_.format\n",
                 message.c_str());
  ok = legal_format && ok;
  HighsInt num_vec;
  if (lp.a_matrix_.isColwise()) {
    num_vec = num_col;
  } else {
    num_vec = num_row;
  }
  const bool partitioned = false;
  vector<HighsInt> a_matrix_p_end;
  bool legal_matrix_dimensions =
      assessMatrixDimensions(log_options, num_vec, partitioned,
                             lp.a_matrix_.start_, a_matrix_p_end,
                             lp.a_matrix_.index_,
                             lp.a_matrix_.value_) == HighsStatus::kOk;
  if (!legal_matrix_dimensions)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix dimensions\n",
                 message.c_str());
  ok = legal_matrix_dimensions && ok;

  HighsInt row_lower_size = lp.row_lower_.size();
  HighsInt row_upper_size = lp.row_upper_.size();
  bool legal_row_lower_size = row_lower_size >= num_row;
  bool legal_row_upper_size = row_upper_size >= num_row;
  if (!legal_row_lower_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on row_lower.size() = %d "
                 "< %d = num_row\n",
                 message.c_str(), (int)row_lower_size, (int)num_row);
  ok = legal_row_lower_size && ok;
  if (!legal_row_upper_size)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on row_upper.size() = %d "
                 "< %d = num_row\n",
                 message.c_str(), (int)row_upper_size, (int)num_row);
  ok = legal_row_upper_size && ok;

  bool legal_a_matrix_num_col = lp.a_matrix_.num_col_ == num_col;
  bool legal_a_matrix_num_row = lp.a_matrix_.num_row_ == num_row;
  if (!legal_a_matrix_num_col)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix.num_col_ = %d "
                 "!= %d = num_col\n",
                 message.c_str(), (int)lp.a_matrix_.num_col_, (int)num_col);
  ok = legal_a_matrix_num_col && ok;
  if (!legal_a_matrix_num_row)
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails on a_matrix.num_row_ = %d "
                 "!= %d = num_row\n",
                 message.c_str(), (int)lp.a_matrix_.num_row_, (int)num_row);
  ok = legal_a_matrix_num_row && ok;

  HighsInt scale_strategy = (HighsInt)lp.scale_.strategy;
  bool legal_scale_strategy = scale_strategy >= 0;
  if (!legal_scale_strategy)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.scale_strategy\n",
        message.c_str());
  ok = legal_scale_strategy && ok;
  HighsInt scale_row_size = (HighsInt)lp.scale_.row.size();
  HighsInt scale_col_size = (HighsInt)lp.scale_.col.size();
  bool legal_scale_num_col = false;
  bool legal_scale_num_row = false;
  bool legal_scale_row_size = false;
  bool legal_scale_col_size = false;
  if (lp.scale_.has_scaling) {
    legal_scale_num_col = lp.scale_.num_col == num_col;
    legal_scale_num_row = lp.scale_.num_row == num_row;
    legal_scale_row_size = scale_row_size >= num_row;
    legal_scale_col_size = scale_col_size >= num_col;
  } else {
    legal_scale_num_col = lp.scale_.num_col == 0;
    legal_scale_num_row = lp.scale_.num_row == 0;
    legal_scale_row_size = scale_row_size == 0;
    legal_scale_col_size = scale_col_size == 0;
  }
  if (!legal_scale_num_col)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.num_col = %d != %d\n",
        message.c_str(), (int)lp.scale_.num_col,
        (int)(lp.scale_.has_scaling ? num_col : 0));
  ok = legal_scale_num_col && ok;
  if (!legal_scale_num_row)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.num_row = %d != %d\n",
        message.c_str(), (int)lp.scale_.num_row,
        (int)(lp.scale_.has_scaling ? num_row : 0));
  ok = legal_scale_num_row && ok;
  if (!legal_scale_col_size)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.col.size() = %d %s %d\n",
        message.c_str(), (int)scale_col_size,
        lp.scale_.has_scaling ? ">=" : "==",
        (int)(lp.scale_.has_scaling ? num_col : 0));
  ok = legal_scale_col_size && ok;
  if (!legal_scale_row_size)
    highsLogUser(
        log_options, HighsLogType::kError,
        "LP dimension validation (%s) fails on scale_.row.size() = %d %s %d\n",
        message.c_str(), (int)scale_row_size,
        lp.scale_.has_scaling ? ">=" : "==",
        (int)(lp.scale_.has_scaling ? num_row : 0));
  ok = legal_scale_row_size && ok;
  if (!ok) {
    highsLogUser(log_options, HighsLogType::kError,
                 "LP dimension validation (%s) fails\n", message.c_str());
  }

  return ok;
}